

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.hpp
# Opt level: O3

void __thiscall boost::uuids::detail::sha1::process_block(sha1 *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  size_t i;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  size_t i_1;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint auStack_1b8 [8];
  uint auStack_198 [8];
  uint auStack_178 [82];
  
  lVar4 = 5;
  do {
    uVar5 = this->h_[lVar4];
    auStack_198[lVar4 + 3] =
         uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x15);
  lVar4 = 0x10;
  do {
    uVar5 = auStack_198[lVar4] ^ auStack_198[lVar4 + 5] ^ auStack_1b8[lVar4 + 2] ^
            auStack_1b8[lVar4];
    auStack_198[lVar4 + 8] = uVar5 << 1 | (uint)((int)uVar5 < 0);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x50);
  uVar5 = this->h_[1];
  uVar1 = this->h_[2];
  uVar2 = this->h_[3];
  uVar3 = this->h_[4];
  uVar8 = 0;
  uVar12 = uVar3;
  uVar14 = uVar2;
  uVar6 = uVar1;
  uVar7 = uVar5;
  uVar15 = this->h_[0];
  do {
    uVar13 = uVar15;
    uVar11 = uVar6;
    uVar9 = uVar14;
    if (uVar8 < 0x14) {
      uVar14 = (uVar11 ^ uVar9) & uVar7 ^ uVar9;
      iVar10 = 0x5a827999;
    }
    else if (uVar8 < 0x28) {
      uVar14 = uVar11 ^ uVar7 ^ uVar9;
      iVar10 = 0x6ed9eba1;
    }
    else if (uVar8 < 0x3c) {
      uVar14 = uVar9 & uVar11 | (uVar9 | uVar11) & uVar7;
      iVar10 = -0x70e44324;
    }
    else {
      uVar14 = uVar11 ^ uVar7 ^ uVar9;
      iVar10 = -0x359d3e2a;
    }
    uVar15 = uVar12 + (uVar13 << 5 | uVar13 >> 0x1b) + uVar14 + iVar10 + auStack_198[uVar8 + 8];
    uVar6 = uVar7 << 0x1e | uVar7 >> 2;
    uVar8 = uVar8 + 1;
    uVar12 = uVar9;
    uVar14 = uVar11;
    uVar7 = uVar13;
  } while (uVar8 != 0x50);
  this->h_[0] = uVar15 + this->h_[0];
  this->h_[1] = uVar13 + uVar5;
  this->h_[2] = uVar6 + uVar1;
  this->h_[3] = uVar11 + uVar2;
  this->h_[4] = uVar9 + uVar3;
  return;
}

Assistant:

inline void sha1::process_block()
{
    unsigned int w[80];
    for (std::size_t i=0; i<16; ++i) {
        w[i]  = (block_[i*4 + 0] << 24);
        w[i] |= (block_[i*4 + 1] << 16);
        w[i] |= (block_[i*4 + 2] << 8);
        w[i] |= (block_[i*4 + 3]);
    }
    for (std::size_t i=16; i<80; ++i) {
        w[i] = left_rotate((w[i-3] ^ w[i-8] ^ w[i-14] ^ w[i-16]), 1);
    }

    unsigned int a = h_[0];
    unsigned int b = h_[1];
    unsigned int c = h_[2];
    unsigned int d = h_[3];
    unsigned int e = h_[4];

    for (std::size_t i=0; i<80; ++i) {
        unsigned int f;
        unsigned int k;

        if (i<20) {
            f = (b & c) | (~b & d);
            k = 0x5A827999;
        } else if (i<40) {
            f = b ^ c ^ d;
            k = 0x6ED9EBA1;
        } else if (i<60) {
            f = (b & c) | (b & d) | (c & d);
            k = 0x8F1BBCDC;
        } else {
            f = b ^ c ^ d;
            k = 0xCA62C1D6;
        }

        unsigned temp = left_rotate(a, 5) + f + e + k + w[i];
        e = d;
        d = c;
        c = left_rotate(b, 30);
        b = a;
        a = temp;
    }

    h_[0] += a;
    h_[1] += b;
    h_[2] += c;
    h_[3] += d;
    h_[4] += e;
}